

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O0

void __thiscall BinarySearchTree::caseB(BinarySearchTree *this,Node *par,Node *loc)

{
  Node *local_28;
  Node *child;
  Node *loc_local;
  Node *par_local;
  BinarySearchTree *this_local;
  
  if (loc->leftChild == (Node *)0x0) {
    local_28 = loc->rightChild;
  }
  else {
    local_28 = loc->leftChild;
  }
  if (par == (Node *)0x0) {
    this->root = local_28;
  }
  else if (loc == par->leftChild) {
    par->leftChild = local_28;
  }
  else {
    par->rightChild = local_28;
  }
  return;
}

Assistant:

void BinarySearchTree::caseB(Node *par, Node *loc) {
    Node *child;
    if (loc->leftChild != nullptr) {
        child = loc->leftChild;
    } else {
        child = loc->rightChild;
    }
    if (par == nullptr) {
        root = child;
    } else {
        if (loc == par->leftChild) {
            par->leftChild = child;
        } else {
            par->rightChild = child;
        }
    }
}